

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::SignalPtr<double,_int>::checkCompatibility(SignalPtr<double,_int> *this)

{
  bool bVar1;
  uint uVar2;
  Signal<double,_int> *pSVar3;
  SignalPtr<double,_int> *this_local;
  
  uVar2 = (*this->_vptr_SignalPtr[4])();
  if (((uVar2 & 1) == 0) || (bVar1 = autoref(this), bVar1)) {
    uVar2 = (*this->_vptr_SignalPtr[6])();
    if (((uVar2 & 1) == 0) || (bVar1 = autoref(this), bVar1)) {
      Signal<double,_int>::checkCompatibility
                ((Signal<double,_int> *)
                 ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
    }
    else {
      (*this->abstractTransmitter->_vptr_SignalBase[0x17])();
    }
  }
  else {
    pSVar3 = getPtr(this);
    (*(pSVar3->super_SignalBase<int>)._vptr_SignalBase[0x17])();
  }
  return;
}

Assistant:

void SignalPtr<T, Time>::checkCompatibility() {
  if (isPlugged() && (!autoref())) {
    getPtr()->checkCompatibility();
  } else if (isAbstractPluged() && (!autoref())) {
    abstractTransmitter->checkCompatibility();
  } else
    Signal<T, Time>::checkCompatibility();
}